

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void mainloop(trans2p *t)

{
  void *__buf;
  ev_impl *peVar1;
  void *pvVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  ev_event ev;
  ev_event local_48;
  
  peVar1 = t->impl;
  puts("mainloop");
  do {
    iVar3 = (*(t->api).poll)(peVar1,0,&local_48);
    pvVar2 = local_48.ptr;
    if (0 < iVar3) {
      if (((byte)local_48.flags & 1) != 0) {
        __buf = (void *)((long)local_48.ptr + 8);
        do {
          sVar4 = read(local_48.fd,__buf,0x800);
          if (sVar4 < 1) {
            if (sVar4 == 0) {
              close(local_48.fd);
              (*(t->api).del)(peVar1,local_48.fd);
              break;
            }
LAB_0010b1c3:
            piVar5 = __errno_location();
            if (*piVar5 != 0xb) {
              perror("read");
            }
          }
          else {
            if (*(code **)((long)pvVar2 + 0x808) == (code *)0x0) goto LAB_0010b1c3;
            (**(code **)((long)pvVar2 + 0x808))(sVar4);
          }
        } while (0 < sVar4);
      }
      tick(t);
      if ((((byte)local_48.flags & 2) != 0) && (*(code **)((long)pvVar2 + 0x810) != (code *)0x0)) {
        (**(code **)((long)pvVar2 + 0x810))(pvVar2);
      }
    }
    if (iVar3 == -1) {
      return;
    }
  } while( true );
}

Assistant:

void mainloop(struct trans2p * t)
{
  struct ev_api * api = &t->api;
  struct ev_impl * impl = t->impl;
  struct ev_event ev;
  struct handler * h;
  int res;
  ssize_t count;
  printf("mainloop\n");
  do
  {
    res = api->poll(impl, 0, &ev);
    if(res > 0)
    {
      h = (struct handler *) ev.ptr;
      if(ev.flags & EV_READ)
      {
        do
        {
          count = read(ev.fd, h->readbuf, sizeof(h->readbuf));
          if(count > 0 && h->read)
          {
            h->read(count, h);
          }
          else if (count == 0)
          {
            // connection closed
            close(ev.fd);
            api->del(impl, ev.fd);
          }
          else if (errno != EAGAIN)
          {
            perror("read");
          }
        }
        while(count > 0);     
      }
      tick(t);
      if (ev.flags & EV_WRITE)
      {
        if(h->write)
          h->write(h);
      }
    }
  }
  while(res != -1);
}